

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue.cpp
# Opt level: O3

void __thiscall libcellml::Issue::Issue(Issue *this)

{
  IssueImpl *pIVar1;
  
  this->_vptr_Issue = (_func_int **)&PTR__Issue_002e7f60;
  pIVar1 = (IssueImpl *)operator_new(0x38);
  pIVar1->mLevel = ERROR;
  pIVar1->mReferenceRule = UNDEFINED;
  (pIVar1->mItem).super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (pIVar1->mDescription).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pIVar1->mDescription).field_2 + 8) = 0;
  (pIVar1->mItem).super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pIVar1->mDescription)._M_dataplus._M_p = (pointer)&(pIVar1->mDescription).field_2;
  (pIVar1->mDescription)._M_string_length = 0;
  pIVar1->mLevel = ERROR;
  AnyCellmlElement::AnyCellmlElementImpl::create();
  this->mPimpl = pIVar1;
  return;
}

Assistant:

Issue::Issue()
    : mPimpl(new IssueImpl())
{
}